

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

string * __thiscall TCLAP::Arg::longID(string *__return_storage_ptr__,Arg *this,string *valueId)

{
  bool bVar1;
  char cVar2;
  allocator local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_22;
  undefined1 local_21;
  string *local_20;
  string *valueId_local;
  Arg *this_local;
  string *id;
  
  local_21 = 0;
  local_20 = valueId;
  valueId_local = (string *)this;
  this_local = (Arg *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  bVar1 = std::operator!=(&this->_flag,"");
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(&local_58,&local_78,&this->_flag);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    if ((this->_valueRequired & 1U) != 0) {
      cVar2 = delimiter();
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,1,cVar2,&local_f9);
      std::operator+(&local_d8,&local_f8,"<");
      std::operator+(&local_b8,&local_d8,local_20);
      std::operator+(&local_98,&local_b8,">");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,",  ");
  }
  nameStartString_abi_cxx11_();
  std::operator+(&local_120,&local_140,&this->_name);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  if ((this->_valueRequired & 1U) != 0) {
    cVar2 = delimiter();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c0,1,cVar2,&local_1c1);
    std::operator+(&local_1a0,&local_1c0,"<");
    std::operator+(&local_180,&local_1a0,local_20);
    std::operator+(&local_160,&local_180,">");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Arg::longID( const std::string& valueId ) const
{
	std::string id = "";

	if ( _flag != "" )
	{
		id += Arg::flagStartString() + _flag;

		if ( _valueRequired )
			id += std::string( 1, Arg::delimiter() ) + "<" + valueId + ">";

		id += ",  ";
	}

	id += Arg::nameStartString() + _name;

	if ( _valueRequired )
		id += std::string( 1, Arg::delimiter() ) + "<" + valueId + ">";

	return id;

}